

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.hpp
# Opt level: O3

Term * __thiscall
FMB::FiniteModelMultiSorted::getDomainConstant(FiniteModelMultiSorted *this,uint c,uint srt)

{
  Symbol *this_00;
  uint function;
  Entry *pEVar1;
  long *plVar2;
  undefined8 *puVar3;
  AtomicSort *pAVar4;
  OperatorKey *key;
  OperatorType *type;
  Term *val;
  ulong *puVar5;
  ulong uVar6;
  undefined8 uVar7;
  string name;
  pair<unsigned_int,_unsigned_int> pair;
  long *local_b8;
  long local_a8;
  undefined8 uStack_a0;
  ulong *local_98;
  long local_90;
  ulong local_88;
  long lStack_80;
  pair<unsigned_int,_unsigned_int> local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_78.second = srt;
  local_78.first = c;
  pEVar1 = Lib::
           DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
           ::findEntry(&this->_domainConstants,&local_78);
  if (pEVar1 != (Entry *)0x0) {
    return pEVar1->_val;
  }
  std::operator+(&local_50,"domCon_",&(DAT_00b521b0->_typeCons)._stack[(int)srt]->_name);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_88 = *puVar5;
    lStack_80 = plVar2[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *puVar5;
    local_98 = (ulong *)*plVar2;
  }
  local_90 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  Lib::Int::toString_abi_cxx11_(&local_70,(Int *)(ulong)c,(uint)local_90);
  uVar6 = 0xf;
  if (local_98 != &local_88) {
    uVar6 = local_88;
  }
  if (uVar6 < local_70._M_string_length + local_90) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar7 = local_70.field_2._M_allocated_capacity;
    }
    if (local_70._M_string_length + local_90 <= (ulong)uVar7) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_98);
      goto LAB_002a7c2d;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_70._M_dataplus._M_p);
LAB_002a7c2d:
  local_b8 = &local_a8;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_a8 = *plVar2;
    uStack_a0 = puVar3[3];
  }
  else {
    local_a8 = *plVar2;
    local_b8 = (long *)*puVar3;
  }
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  function = Kernel::Signature::addFreshFunction(DAT_00b521b0,0,(char *)local_b8,(char *)0x0);
  pAVar4 = Kernel::AtomicSort::create(srt,0,(TermList *)0x0);
  this_00 = (DAT_00b521b0->_funs)._stack[function];
  key = Kernel::OperatorType::setupKey(0,(TermList *)0x0);
  *(AtomicSort **)(key + 8) = pAVar4;
  type = Kernel::OperatorType::getTypeFromKey(key,0);
  Kernel::Signature::Symbol::setType(this_00,type);
  val = Kernel::Term::create(function,0,(TermList *)0x0);
  Lib::
  DHMap<std::pair<unsigned_int,_unsigned_int>,_Kernel::Term_*,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::insert(&this->_domainConstants,local_78,val);
  Lib::
  DHMap<Kernel::Term_*,_std::pair<unsigned_int,_unsigned_int>,_Lib::DefaultHash,_Lib::DefaultHash2>
  ::insert(&this->_domainConstantsRev,val,local_78);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  return val;
}

Assistant:

Term* getDomainConstant(unsigned c, unsigned srt)
  {
    Term* t;
    std::pair<unsigned,unsigned> pair = std::make_pair(c,srt);
    if(_domainConstants.find(pair,t)) return t;
    std::string name = "domCon_"+env.signature->typeConName(srt)+"_"+Lib::Int::toString(c);
    unsigned f = env.signature->addFreshFunction(0,name.c_str());
    TermList srtT = TermList(AtomicSort::createConstant(srt));
    env.signature->getFunction(f)->setType(OperatorType::getConstantsType(srtT));
    t = Term::createConstant(f);
    _domainConstants.insert(pair,t);
    _domainConstantsRev.insert(t,pair);

    return t;
  }